

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.cpp
# Opt level: O2

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_13(void)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  ExpressionDecomposer local_dc;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> r;
  int local_d4;
  Result local_d0;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *local_b0;
  Enum local_a8;
  ResultBuilder DOCTEST_RB;
  
  r = 0xb;
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/tuple/get.cpp"
             ,0x39,"r == 11","",(String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_dc,DT_CHECK);
  local_b0 = &r;
  local_a8 = local_dc.m_at;
  local_d4 = 0xb;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_d0,(Expression_lhs<int_const&> *)&local_b0,&local_d4);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  return;
}

Assistant:

dummy ()
        {
            ++instances_count;
        }